

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleanimation.cpp
# Opt level: O1

void __thiscall QScrollbarStyleAnimation::updateCurrentTime(QScrollbarStyleAnimation *this,int time)

{
  char *pcVar1;
  long in_FS_OFFSET;
  ulong uVar2;
  qreal qVar3;
  QVariant QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStyleAnimation::updateCurrentTime((QStyleAnimation *)this,time);
  if (*(int *)(this + 0x40) == 1) {
    qVar3 = QNumberStyleAnimation::currentValue((QNumberStyleAnimation *)this);
    uVar2 = -(ulong)(qVar3 < -qVar3);
    if ((double)(~uVar2 & (ulong)qVar3 | (ulong)-qVar3 & uVar2) <= 1e-12) {
      pcVar1 = *(char **)(*(long *)(this + 8) + 0x10);
      ::QVariant::QVariant(&QStack_38,false);
      QObject::doSetProperty(pcVar1,(QVariant *)0x674b44,&QStack_38);
      ::QVariant::~QVariant(&QStack_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollbarStyleAnimation::updateCurrentTime(int time)
{
    QNumberStyleAnimation::updateCurrentTime(time);
    if (_mode == Deactivating && qFuzzyIsNull(currentValue()))
        target()->setProperty("visible", false);
}